

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

int * Gia_ManToResub(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int *pObjs;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  piVar2 = (int *)calloc((long)(iVar1 << 1),4);
  iVar1 = Gia_ManIsNormalized(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManIsNormalized(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x1f5,"int *Gia_ManToResub(Gia_Man_t *)");
  }
  pObjs._4_4_ = 1;
  while( true ) {
    bVar4 = false;
    if (pObjs._4_4_ < p->nObjs) {
      pGStack_18 = Gia_ManObj(p,pObjs._4_4_);
      bVar4 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsCi(pGStack_18);
    if (iVar1 == 0) {
      pGVar3 = Gia_ManObj(p,pObjs._4_4_);
      iVar1 = Gia_ObjFaninLit0(pGVar3,pObjs._4_4_);
      piVar2[pObjs._4_4_ << 1] = iVar1;
      iVar1 = Gia_ObjIsCo(pGStack_18);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(pGStack_18);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                        ,0x1ff,"int *Gia_ManToResub(Gia_Man_t *)");
        }
        pGVar3 = Gia_ManObj(p,pObjs._4_4_);
        iVar1 = Gia_ObjFaninLit1(pGVar3,pObjs._4_4_);
        piVar2[pObjs._4_4_ * 2 + 1] = iVar1;
      }
      else {
        piVar2[pObjs._4_4_ * 2 + 1] = piVar2[pObjs._4_4_ << 1];
      }
    }
    pObjs._4_4_ = pObjs._4_4_ + 1;
  }
  return piVar2;
}

Assistant:

int * Gia_ManToResub( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, * pObjs = ABC_CALLOC( int, 2*Gia_ManObjNum(p) );
    assert( Gia_ManIsNormalized(p) );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            continue;
        pObjs[2*i+0] = Gia_ObjFaninLit0(Gia_ManObj(p, i), i);
        if ( Gia_ObjIsCo(pObj) )
            pObjs[2*i+1] = pObjs[2*i+0];
        else if ( Gia_ObjIsAnd(pObj) )
            pObjs[2*i+1] = Gia_ObjFaninLit1(Gia_ManObj(p, i), i);
        else assert( 0 );
    }
    return pObjs;
}